

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsPostsolveStack.h
# Opt level: O3

void __thiscall
presolve::HighsPostsolveStack::undoIterateBackwards<HighsBasisStatus>
          (HighsPostsolveStack *this,
          vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *values,
          vector<int,_std::allocator<int>_> *index,HighsInt origSize)

{
  pointer piVar1;
  pointer pHVar2;
  long lVar3;
  
  std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize(values,(long)origSize);
  piVar1 = (index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  lVar3 = (long)(index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  if (lVar3 != 0) {
    lVar3 = lVar3 >> 2;
    pHVar2 = (values->super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>).
             _M_impl.super__Vector_impl_data._M_start;
    do {
      pHVar2[piVar1[lVar3 + -1]] = pHVar2[lVar3 + -1];
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  return;
}

Assistant:

void undoIterateBackwards(std::vector<T>& values,
                            const std::vector<HighsInt>& index,
                            HighsInt origSize) {
    values.resize(origSize);
#ifdef DEBUG_EXTRA
    // Fill vector with NaN for debugging purposes
    std::vector<T> valuesNew;
    valuesNew.resize(origSize, std::numeric_limits<T>::signaling_NaN());
    for (size_t i = index.size(); i > 0; --i) {
      assert(static_cast<size_t>(index[i - 1]) >= i - 1);
      valuesNew[index[i - 1]] = values[i - 1];
    }
    std::copy(valuesNew.cbegin(), valuesNew.cend(), values.begin());
#else
    for (size_t i = index.size(); i > 0; --i) {
      assert(static_cast<size_t>(index[i - 1]) >= i - 1);
      values[index[i - 1]] = values[i - 1];
    }
#endif
  }